

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O2

void ZSTD_safecopy(BYTE *op,BYTE *oend_w,BYTE *ip,ptrdiff_t length,ZSTD_overlap_e ovtype)

{
  BYTE *pBVar1;
  BYTE BVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  BYTE *pBVar6;
  long lVar7;
  ulong uVar8;
  
  uVar8 = (long)op - (long)ip;
  pBVar1 = op + length;
  if (ovtype == ZSTD_no_overlap) {
    if (op < oend_w && uVar8 + 7 < 0xf) goto LAB_0063052a;
    if (length < 8) goto LAB_006303e7;
  }
  else {
    if ((ovtype != ZSTD_overlap_src_before_dst) || ((long)uVar8 < 0)) {
LAB_0063052a:
      __assert_fail("(ovtype == ZSTD_no_overlap && (diff <= -8 || diff >= 8 || op >= oend_w)) || (ovtype == ZSTD_overlap_src_before_dst && diff >= 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x328,
                    "void ZSTD_safecopy(BYTE *, const BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                   );
    }
    if (length < 8) {
LAB_006303e7:
      for (; op < pBVar1; op = op + 1) {
        BVar2 = *ip;
        ip = ip + 1;
        *op = BVar2;
      }
      return;
    }
    if (op < ip) {
      __assert_fail("*ip <= *op",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x303,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
    }
    if (uVar8 < 8) {
      iVar3 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar8 * 4);
      *op = *ip;
      op[1] = ip[1];
      op[2] = ip[2];
      op[3] = ip[3];
      pBVar6 = ip + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar8 * 4);
      ip = ip + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar8 * 4) - (long)iVar3);
      *(undefined4 *)(op + 4) = *(undefined4 *)pBVar6;
    }
    else {
      *(undefined8 *)op = *(undefined8 *)ip;
    }
    ip = ip + 8;
    op = op + 8;
    if ((long)op - (long)ip < 8) {
      __assert_fail("*op - *ip >= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x315,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
    }
    length = length - 8;
  }
  if (oend_w < pBVar1) {
    if (op <= oend_w) {
      lVar5 = (long)oend_w - (long)op;
      if ((ovtype == ZSTD_no_overlap) || (pBVar6 = ip, 0xf < (long)op - (long)ip)) {
        if (0xffffffffffffffe0 < ((long)op - (long)ip) - 0x10U) goto LAB_00630587;
        uVar4 = *(undefined8 *)(ip + 8);
        *(undefined8 *)op = *(undefined8 *)ip;
        *(undefined8 *)(op + 8) = uVar4;
        if (0x10 < lVar5) {
          lVar7 = 0x10;
          do {
            uVar4 = *(undefined8 *)(ip + lVar7 + 8);
            pBVar6 = op + lVar7;
            *(undefined8 *)pBVar6 = *(undefined8 *)(ip + lVar7);
            *(undefined8 *)(pBVar6 + 8) = uVar4;
            uVar4 = *(undefined8 *)(ip + lVar7 + 0x10 + 8);
            *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)(ip + lVar7 + 0x10);
            *(undefined8 *)(pBVar6 + 0x18) = uVar4;
            lVar7 = lVar7 + 0x20;
          } while (pBVar6 + 0x20 < oend_w);
        }
      }
      else {
        do {
          *(undefined8 *)op = *(undefined8 *)pBVar6;
          op = op + 8;
          pBVar6 = pBVar6 + 8;
        } while (op < oend_w);
      }
      ip = ip + lVar5;
      op = oend_w;
    }
    for (; op < pBVar1; op = op + 1) {
      BVar2 = *ip;
      ip = ip + 1;
      *op = BVar2;
    }
  }
  else {
    pBVar1 = op + length;
    if ((ovtype == ZSTD_no_overlap) || (0xf < (long)op - (long)ip)) {
      if (0xffffffffffffffe0 < ((long)op - (long)ip) - 0x10U) {
LAB_00630587:
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/zstd_internal.h"
                      ,0xe9,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar4 = *(undefined8 *)(ip + 8);
      *(undefined8 *)op = *(undefined8 *)ip;
      *(undefined8 *)(op + 8) = uVar4;
      if (0x10 < (ulong)length) {
        lVar5 = 0x10;
        do {
          uVar4 = *(undefined8 *)(ip + lVar5 + 8);
          pBVar6 = op + lVar5;
          *(undefined8 *)pBVar6 = *(undefined8 *)(ip + lVar5);
          *(undefined8 *)(pBVar6 + 8) = uVar4;
          uVar4 = *(undefined8 *)(ip + lVar5 + 0x10 + 8);
          *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)(ip + lVar5 + 0x10);
          *(undefined8 *)(pBVar6 + 0x18) = uVar4;
          lVar5 = lVar5 + 0x20;
        } while (pBVar6 + 0x20 < pBVar1);
      }
    }
    else {
      do {
        *(undefined8 *)op = *(undefined8 *)ip;
        op = op + 8;
        ip = ip + 8;
      } while (op < pBVar1);
    }
  }
  return;
}

Assistant:

static void ZSTD_safecopy(BYTE* op, const BYTE* const oend_w, BYTE const* ip, ptrdiff_t length, ZSTD_overlap_e ovtype) {
    ptrdiff_t const diff = op - ip;
    BYTE* const oend = op + length;

    assert((ovtype == ZSTD_no_overlap && (diff <= -8 || diff >= 8 || op >= oend_w)) ||
           (ovtype == ZSTD_overlap_src_before_dst && diff >= 0));

    if (length < 8) {
        /* Handle short lengths. */
        while (op < oend) *op++ = *ip++;
        return;
    }
    if (ovtype == ZSTD_overlap_src_before_dst) {
        /* Copy 8 bytes and ensure the offset >= 8 when there can be overlap. */
        assert(length >= 8);
        ZSTD_overlapCopy8(&op, &ip, diff);
        length -= 8;
        assert(op - ip >= 8);
        assert(op <= oend);
    }

    if (oend <= oend_w) {
        /* No risk of overwrite. */
        ZSTD_wildcopy(op, ip, length, ovtype);
        return;
    }
    if (op <= oend_w) {
        /* Wildcopy until we get close to the end. */
        assert(oend > oend_w);
        ZSTD_wildcopy(op, ip, oend_w - op, ovtype);
        ip += oend_w - op;
        op += oend_w - op;
    }
    /* Handle the leftovers. */
    while (op < oend) *op++ = *ip++;
}